

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  bool bVar1;
  string *args;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  reference ppcVar2;
  string local_220;
  string local_200;
  cmAlphaNum local_1e0;
  cmAlphaNum local_1b0;
  undefined1 local_180 [8];
  string linkName4;
  string *fullPath;
  cmSourceFile *file;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *children;
  string local_110;
  char local_da [2];
  char *local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string linkName3;
  cmSourceGroup *sg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__range1;
  cmXMLWriter *xml_local;
  string *linkName_local;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  __end1 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin(sourceGroups);
  sg = (cmSourceGroup *)
       std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(sourceGroups);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                *)&sg);
    if (!bVar1) break;
    linkName3.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
         ::operator*(&__end1);
    cmAlphaNum::cmAlphaNum(&local_98,linkName);
    cmAlphaNum::cmAlphaNum(&local_c8,'/');
    args = cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)linkName3.field_2._8_8_);
    cmStrCat<std::__cxx11::string>((string *)local_68,&local_98,&local_c8,args);
    local_d0._M_current = (char *)std::__cxx11::string::begin();
    local_d8 = (char *)std::__cxx11::string::end();
    local_da[1] = 0x5c;
    local_da[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_d0,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_d8,local_da + 1,local_da);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"virtual:/virtual",(allocator<char> *)((long)&children + 7));
    AppendLinkedResource(xml,(string *)local_68,&local_110,VirtualFolder);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&children + 7));
    sFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)cmSourceGroup::GetGroupChildren((cmSourceGroup *)linkName3.field_2._8_8_);
    bVar1 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::empty
                      ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                       sFiles.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      WriteGroups(this,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                       sFiles.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,linkName,xml);
    }
    __x = cmSourceGroup::GetSourceFiles((cmSourceGroup *)linkName3.field_2._8_8_);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2,__x)
    ;
    __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range2);
    file = (cmSourceFile *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      &__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                  *)&file);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end2);
      linkName4.field_2._8_8_ = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar2);
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)linkName4.field_2._8_8_);
      if (!bVar1) {
        cmAlphaNum::cmAlphaNum(&local_1b0,(string *)local_68);
        cmAlphaNum::cmAlphaNum(&local_1e0,'/');
        cmsys::SystemTools::GetFilenameName(&local_200,(string *)linkName4.field_2._8_8_);
        cmStrCat<std::__cxx11::string>((string *)local_180,&local_1b0,&local_1e0,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        GetEclipsePath(&local_220,(string *)linkName4.field_2._8_8_);
        AppendLinkedResource(xml,(string *)local_180,&local_220,LinkToFile);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)local_180);
      }
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range2);
    std::__cxx11::string::~string((string *)local_68);
    __gnu_cxx::
    __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = cmStrCat(linkName, '/', sg.GetFullName());

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 =
          cmStrCat(linkName3, '/', cmSystemTools::GetFilenameName(fullPath));
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}